

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

int __thiscall
particleSamples::read_in_particle_samples_SMASH_binary
          (particleSamples *this,ifstream *SMASH_inputfile,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *resulting_particle_list)

{
  ulong uVar1;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *this_00;
  value_type *in_RDX;
  long *in_RSI;
  vector<particle_info,_std::allocator<particle_info>_> *in_RDI;
  particle_info temp_particle_info;
  double origin_z;
  double origin_y;
  double origin_x;
  double dt;
  double vz;
  double vy;
  double vx;
  double origin_t;
  int32_t pdg_mother2;
  int32_t pdg_mother1;
  int32_t proc_type_origin;
  int32_t proc_id_origin;
  int32_t ncoll;
  int32_t charge;
  int32_t id;
  int32_t pdg;
  double time_last_coll;
  double xsecfac;
  double form_time;
  double pz;
  double py;
  double px;
  double p0;
  double m;
  double z;
  double y;
  double x;
  double t;
  size_t i;
  uint32_t n_part_lines;
  char empty;
  double impact_parameter;
  uint32_t ev;
  char block_type;
  int num_particles;
  int ievent;
  value_type *in_stack_fffffffffffffe58;
  value_type *__x;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  particleSamples *in_stack_fffffffffffffe80;
  undefined1 local_d0 [4];
  undefined1 local_cc [4];
  undefined1 local_c8 [4];
  undefined1 local_c4 [4];
  undefined1 local_c0 [4];
  undefined1 local_bc [4];
  undefined1 local_b8 [4];
  undefined1 local_b4 [4];
  undefined1 local_b0 [8];
  undefined1 local_a8 [8];
  undefined1 local_a0 [8];
  undefined1 local_98 [8];
  undefined1 local_90 [8];
  undefined1 local_88 [8];
  undefined1 local_80 [8];
  undefined1 local_78 [8];
  undefined1 local_70 [8];
  undefined1 local_68 [8];
  undefined1 local_60 [8];
  undefined1 local_58 [8];
  ulong local_50;
  uint local_44;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *local_40;
  undefined1 local_31;
  undefined1 local_30 [8];
  undefined1 local_28 [7];
  char local_21;
  int local_20;
  int local_1c;
  value_type *local_18;
  long *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  clear_out_previous_record
            (in_stack_fffffffffffffe80,
             (vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
              *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  local_1c = 0;
  local_20 = 0;
  while( true ) {
    if (*(int *)&in_RDI[0x3f].super__Vector_base<particle_info,_std::allocator<particle_info>_>.
                 _M_impl.super__Vector_impl_data._M_finish <= local_20) {
      return 0;
    }
    std::istream::read((char *)local_10,(long)&local_21);
    uVar1 = std::ios::operator!((ios *)((long)local_10 + *(long *)(*local_10 + -0x18)));
    if ((uVar1 & 1) != 0) break;
    if (local_21 == 'f') {
      std::istream::read((char *)local_10,(long)local_28);
      std::istream::read((char *)local_10,(long)local_30);
      if (6 < *(ushort *)
               &in_RDI[0x3e].super__Vector_base<particle_info,_std::allocator<particle_info>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
        std::istream::read((char *)local_10,(long)&local_31);
      }
    }
    else {
      if (local_21 != 'p') {
        return 0;
      }
      __x = local_18;
      this_00 = (vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                 *)operator_new(0x18);
      std::vector<particle_info,_std::allocator<particle_info>_>::vector
                ((vector<particle_info,_std::allocator<particle_info>_> *)0x148177);
      local_40 = this_00;
      std::
      vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      ::push_back(this_00,in_stack_fffffffffffffe58);
      std::istream::read((char *)local_10,(long)&local_44);
      for (local_50 = 0; local_50 < local_44; local_50 = local_50 + 1) {
        std::istream::read((char *)local_10,(long)local_58);
        std::istream::read((char *)local_10,(long)local_60);
        std::istream::read((char *)local_10,(long)local_68);
        std::istream::read((char *)local_10,(long)local_70);
        std::istream::read((char *)local_10,(long)local_78);
        std::istream::read((char *)local_10,(long)local_80);
        std::istream::read((char *)local_10,(long)local_88);
        std::istream::read((char *)local_10,(long)local_90);
        std::istream::read((char *)local_10,(long)local_98);
        std::istream::read((char *)local_10,(long)local_b4);
        std::istream::read((char *)local_10,(long)local_b8);
        std::istream::read((char *)local_10,(long)local_bc);
        std::istream::read((char *)local_10,(long)local_c0);
        std::istream::read((char *)local_10,(long)local_a0);
        std::istream::read((char *)local_10,(long)local_a8);
        std::istream::read((char *)local_10,(long)local_c4);
        std::istream::read((char *)local_10,(long)local_c8);
        std::istream::read((char *)local_10,(long)local_b0);
        std::istream::read((char *)local_10,(long)local_cc);
        std::istream::read((char *)local_10,(long)local_d0);
        std::
        vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
        ::operator[]((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                      *)local_18,(long)local_1c);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back(in_RDI,__x);
      }
      local_20 = local_44 + local_20;
      local_1c = local_1c + 1;
    }
  }
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_SMASH_binary(
    std::ifstream &SMASH_inputfile,
    std::vector<std::vector<particle_info> *> *resulting_particle_list) {
    // clean out the previous record
    clear_out_previous_record(resulting_particle_list);
    int ievent = 0, num_particles = 0;
    while (num_particles < event_buffer_size) {
        char block_type;
        SMASH_inputfile.read(&block_type, sizeof(char));
        if (!SMASH_inputfile) {
            break;
        }
        if (block_type == 'f') {
            uint32_t ev;
            double impact_parameter;
            char empty;
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&ev), sizeof(std::uint32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&impact_parameter), sizeof(double));
            if (smash_format_version_ > 6) {
                SMASH_inputfile.read(&empty, sizeof(char));
            }
            continue;
        }
        if (block_type != 'p') {
            break;
        }
        resulting_particle_list->push_back(new vector<particle_info>);

        uint32_t n_part_lines;
        SMASH_inputfile.read(
            reinterpret_cast<char *>(&n_part_lines), sizeof(std::uint32_t));
        for (size_t i = 0; i < n_part_lines; i++) {
            double t, x, y, z, m, p0, px, py, pz, form_time, xsecfac,
                time_last_coll;
            int32_t pdg, id, charge, ncoll, proc_id_origin, proc_type_origin,
                pdg_mother1, pdg_mother2;
            SMASH_inputfile.read(reinterpret_cast<char *>(&t), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&x), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&y), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&z), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&m), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&p0), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&px), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&py), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&pz), sizeof(double));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&pdg), sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&id), sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&charge), sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&ncoll), sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&form_time), sizeof(double));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&xsecfac), sizeof(double));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&proc_id_origin),
                sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&proc_type_origin),
                sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&time_last_coll), sizeof(double));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&pdg_mother1), sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&pdg_mother2), sizeof(std::int32_t));

            double origin_t = time_last_coll;
            double vx = px / p0, vy = py / p0, vz = pz / p0;
            double dt = t - origin_t;
            double origin_x = x - vx * dt, origin_y = y - vy * dt,
                   origin_z = z - vz * dt;

            particle_info temp_particle_info;
            temp_particle_info.monval = pdg;
            temp_particle_info.mass = m;
            temp_particle_info.t = origin_t;
            temp_particle_info.x = origin_x;
            temp_particle_info.y = origin_y;
            temp_particle_info.z = origin_z;
            temp_particle_info.E = p0;
            temp_particle_info.px = px;
            temp_particle_info.py = py;
            temp_particle_info.pz = pz;

            (*resulting_particle_list)[ievent]->push_back(temp_particle_info);
        }
        num_particles += n_part_lines;
        // std::cout << "Read in " << n_part_lines << " particles" << std::endl;
        ievent++;
    }
    return 0;
}